

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::compute_degree(Graph *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  reference pvVar5;
  reference pvVar6;
  vertex_t i;
  ulong __n;
  
  for (__n = 0; __n < this->num_vertices_; __n = __n + 1) {
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->succ_,__n);
    puVar1 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->pred_,__n);
    puVar3 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->deg_,__n);
    *pvVar6 = (int)((ulong)((long)puVar3 - (long)puVar4) >> 2) +
              (int)((ulong)((long)puVar1 - (long)puVar2) >> 2);
  }
  return;
}

Assistant:

void Graph::compute_degree() {
    for (vertex_t i = 0; i < num_vertices_; ++i) {
        deg_.at(i) = (degree_t)succ_.at(i).size() + (degree_t)pred_.at(i).size();
    }
}